

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreePrintBox(Acec_Box_t *pBox,Vec_Int_t *vAdds)

{
  uint uVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  long lVar5;
  
  puts("Adders:");
  Acec_PrintAdders(pBox->vAdds,vAdds);
  puts("Inputs:");
  pVVar2 = pBox->vLeafLits;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      pVVar3 = pVVar2->pArray;
      printf(" %4d : %2d  {",uVar4 & 0xffffffff,(ulong)(uint)pVVar3[uVar4].nSize);
      if (0 < pVVar3[uVar4].nSize) {
        lVar5 = 0;
        do {
          uVar1 = pVVar3[uVar4].pArray[lVar5];
          if ((int)uVar1 < 0) goto LAB_0067e97d;
          printf(" %c%d",(ulong)((uVar1 & 1) * 2 + 0x2b),(ulong)(uVar1 >> 1));
          lVar5 = lVar5 + 1;
        } while (lVar5 < pVVar3[uVar4].nSize);
      }
      puts(" }");
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  puts("Outputs:");
  pVVar2 = pBox->vRootLits;
  if (0 < pVVar2->nSize) {
    uVar4 = 0;
    do {
      pVVar3 = pVVar2->pArray;
      printf(" %4d : %2d  {",uVar4 & 0xffffffff,(ulong)(uint)pVVar3[uVar4].nSize);
      if (0 < pVVar3[uVar4].nSize) {
        lVar5 = 0;
        do {
          uVar1 = pVVar3[uVar4].pArray[lVar5];
          if ((int)uVar1 < 0) {
LAB_0067e97d:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          printf(" %c%d",(ulong)((uVar1 & 1) * 2 + 0x2b),(ulong)(uVar1 >> 1));
          lVar5 = lVar5 + 1;
        } while (lVar5 < pVVar3[uVar4].nSize);
      }
      puts(" }");
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  return;
}

Assistant:

void Acec_TreePrintBox( Acec_Box_t * pBox, Vec_Int_t * vAdds )
{
    printf( "Adders:\n" );
    Acec_PrintAdders( pBox->vAdds, vAdds );
    printf( "Inputs:\n" );
    Vec_WecPrintLits( pBox->vLeafLits );
    printf( "Outputs:\n" );
    Vec_WecPrintLits( pBox->vRootLits );
//    printf( "Node %d has level %d.\n", 3715, Gia_ObjLevelId(pBox->pGia, 3715) );
//    printf( "Node %d has level %d.\n", 167, Gia_ObjLevelId(pBox->pGia, 167) );
//    printf( "Node %d has level %d.\n", 278, Gia_ObjLevelId(pBox->pGia, 278) );
//    printf( "Node %d has level %d.\n", 597, Gia_ObjLevelId(pBox->pGia, 597) );
}